

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheIterator::SetValue(CacheIterator *this,char *value)

{
  bool bVar1;
  CacheEntry *this_00;
  CacheEntry *entry;
  char *value_local;
  CacheIterator *this_local;
  
  bVar1 = IsAtEnd(this);
  if (!bVar1) {
    this_00 = GetEntry(this);
    if (value == (char *)0x0) {
      std::__cxx11::string::clear();
    }
    else {
      std::__cxx11::string::operator=((string *)this_00,value);
      this_00->Initialized = true;
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheIterator::SetValue(const char* value)
{
  if (this->IsAtEnd()) {
    return;
  }
  CacheEntry* entry = &this->GetEntry();
  if (value) {
    entry->Value = value;
    entry->Initialized = true;
  } else {
    entry->Value.clear();
  }
}